

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadShift(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  void *Decoder_00;
  MCInst *in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  byte bVar7;
  byte bVar8;
  _Bool hasV7Ops;
  _Bool hasMP;
  uint64_t featureBits;
  uint Rn;
  uint Rt;
  uint addrmode;
  DecodeStatus S;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  uVar5 = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,4);
  Decoder_00 = (void *)ARM_getFeatureBits(in_RDI->csh->mode);
  bVar7 = ((ulong)Decoder_00 & 0x8000) != 0;
  bVar8 = ((ulong)Decoder_00 & 0x10000000000) != 0;
  if (uVar3 == 0xf) {
    uVar4 = MCInst_getOpcode(in_RDI);
    if (uVar4 == 0x951) {
      MCInst_setOpcode(in_RDI,0x94f);
    }
    else if (uVar4 == 0x960) {
      MCInst_setOpcode(in_RDI,0x95e);
    }
    else if (uVar4 == 0x968) {
      MCInst_setOpcode(in_RDI,0x966);
    }
    else if (uVar4 == 0x970) {
      MCInst_setOpcode(in_RDI,0x96e);
    }
    else if (uVar4 == 0x979) {
      MCInst_setOpcode(in_RDI,0x976);
    }
    else if (uVar4 == 0x9ba) {
      MCInst_setOpcode(in_RDI,0x9b9);
    }
    else {
      if (uVar4 != 0x9be) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(in_RDI,0x9bd);
    }
    local_4 = DecodeT2LoadLabel((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar5,
                                (uint64_t)in_RCX,(void *)CONCAT44(local_4,in_stack_ffffffffffffffd0)
                               );
  }
  else {
    if (uVar2 == 0xf) {
      in_stack_ffffffffffffffb4 = MCInst_getOpcode(in_RDI);
      if (in_stack_ffffffffffffffb4 == 0x960) {
        MCInst_setOpcode(in_RDI,0x9b6);
      }
      else if (in_stack_ffffffffffffffb4 == 0x968) {
        MCInst_setOpcode(in_RDI,0x9be);
      }
      else if (in_stack_ffffffffffffffb4 == 0x970) {
        return MCDisassembler_Fail;
      }
    }
    uVar5 = MCInst_getOpcode(in_RDI);
    if (uVar5 == 0x9b6) {
      if (((bVar8 & 1) == 0) || ((bVar7 & 1) == 0)) {
        return MCDisassembler_Fail;
      }
    }
    else if (uVar5 != 0x9ba) {
      if (uVar5 == 0x9be) {
        if ((bVar8 & 1) == 0) {
          return MCDisassembler_Fail;
        }
      }
      else {
        DVar6 = DecodeGPRRegisterClass
                          ((MCInst *)CONCAT44(uVar2,uVar3),(uint)((ulong)Decoder_00 >> 0x20),
                           CONCAT17(bVar7,CONCAT16(bVar8,CONCAT24(in_stack_ffffffffffffffbc,
                                                                  in_stack_ffffffffffffffb8))),
                           (void *)CONCAT44(in_stack_ffffffffffffffb4,uVar5));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
    }
    fieldFromInstruction_4(in_ESI,4,2);
    fieldFromInstruction_4(in_ESI,0,4);
    fieldFromInstruction_4(in_ESI,0x10,4);
    DVar6 = DecodeT2AddrModeSOReg(in_RCX,local_4,CONCAT44(uVar2,uVar3),Decoder_00);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2LoadShift(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned addrmode;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBs:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHs:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHs:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRSBs:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRs:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2PLDs:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIs:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}

		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHs:
				return MCDisassembler_Fail;
			case ARM_t2LDRHs:
				MCInst_setOpcode(Inst, ARM_t2PLDWs);
				break;
			case ARM_t2LDRSBs:
				MCInst_setOpcode(Inst, ARM_t2PLIs);
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDs:
			break;
		case ARM_t2PLIs:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWs:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	addrmode = fieldFromInstruction_4(Insn, 4, 2);
	addrmode |= fieldFromInstruction_4(Insn, 0, 4) << 2;
	addrmode |= fieldFromInstruction_4(Insn, 16, 4) << 6;
	if (!Check(&S, DecodeT2AddrModeSOReg(Inst, addrmode, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}